

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::LayerParameter::InternalSwap(LayerParameter *this,LayerParameter *other)

{
  int iVar1;
  uint32 uVar2;
  string *psVar3;
  TransformationParameter *pTVar4;
  LossParameter *pLVar5;
  AccuracyParameter *pAVar6;
  ArgMaxParameter *pAVar7;
  ConcatParameter *pCVar8;
  ContrastiveLossParameter *pCVar9;
  ConvolutionParameter *pCVar10;
  DataParameter *pDVar11;
  DropoutParameter *pDVar12;
  DummyDataParameter *pDVar13;
  EltwiseParameter *pEVar14;
  ExpParameter *pEVar15;
  HDF5DataParameter *pHVar16;
  HDF5OutputParameter *pHVar17;
  HingeLossParameter *pHVar18;
  ImageDataParameter *pIVar19;
  InfogainLossParameter *pIVar20;
  InnerProductParameter *pIVar21;
  LRNParameter *pLVar22;
  MemoryDataParameter *pMVar23;
  MVNParameter *pMVar24;
  PoolingParameter *pPVar25;
  PowerParameter *pPVar26;
  ReLUParameter *pRVar27;
  SigmoidParameter *pSVar28;
  SoftmaxParameter *pSVar29;
  SliceParameter *pSVar30;
  TanHParameter *pTVar31;
  ThresholdParameter *pTVar32;
  WindowDataParameter *pWVar33;
  PythonParameter *pPVar34;
  PReLUParameter *pPVar35;
  SPPParameter *pSVar36;
  ReshapeParameter *pRVar37;
  LogParameter *pLVar38;
  FlattenParameter *pFVar39;
  ReductionParameter *pRVar40;
  EmbedParameter *pEVar41;
  TileParameter *pTVar42;
  BatchNormParameter *pBVar43;
  ELUParameter *pEVar44;
  BiasParameter *pBVar45;
  ScaleParameter *pSVar46;
  InputParameter *pIVar47;
  CropParameter *pCVar48;
  ParameterParameter *pPVar49;
  RecurrentParameter *pRVar50;
  void *pvVar51;
  UnknownFieldSet *other_00;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->bottom_).super_RepeatedPtrFieldBase,
             &(other->bottom_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->top_).super_RepeatedPtrFieldBase,&(other->top_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<float>::InternalSwap(&this->loss_weight_,&other->loss_weight_);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->param_).super_RepeatedPtrFieldBase,&(other->param_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->blobs_).super_RepeatedPtrFieldBase,&(other->blobs_).super_RepeatedPtrFieldBase)
  ;
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->include_).super_RepeatedPtrFieldBase,
             &(other->include_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->exclude_).super_RepeatedPtrFieldBase,
             &(other->exclude_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<bool>::InternalSwap
            (&this->propagate_down_,&other->propagate_down_);
  psVar3 = (this->name_).ptr_;
  (this->name_).ptr_ = (other->name_).ptr_;
  (other->name_).ptr_ = psVar3;
  psVar3 = (this->type_).ptr_;
  (this->type_).ptr_ = (other->type_).ptr_;
  (other->type_).ptr_ = psVar3;
  pTVar4 = this->transform_param_;
  this->transform_param_ = other->transform_param_;
  other->transform_param_ = pTVar4;
  pLVar5 = this->loss_param_;
  this->loss_param_ = other->loss_param_;
  other->loss_param_ = pLVar5;
  pAVar6 = this->accuracy_param_;
  this->accuracy_param_ = other->accuracy_param_;
  other->accuracy_param_ = pAVar6;
  pAVar7 = this->argmax_param_;
  this->argmax_param_ = other->argmax_param_;
  other->argmax_param_ = pAVar7;
  pCVar8 = this->concat_param_;
  this->concat_param_ = other->concat_param_;
  other->concat_param_ = pCVar8;
  pCVar9 = this->contrastive_loss_param_;
  this->contrastive_loss_param_ = other->contrastive_loss_param_;
  other->contrastive_loss_param_ = pCVar9;
  pCVar10 = this->convolution_param_;
  this->convolution_param_ = other->convolution_param_;
  other->convolution_param_ = pCVar10;
  pDVar11 = this->data_param_;
  this->data_param_ = other->data_param_;
  other->data_param_ = pDVar11;
  pDVar12 = this->dropout_param_;
  this->dropout_param_ = other->dropout_param_;
  other->dropout_param_ = pDVar12;
  pDVar13 = this->dummy_data_param_;
  this->dummy_data_param_ = other->dummy_data_param_;
  other->dummy_data_param_ = pDVar13;
  pEVar14 = this->eltwise_param_;
  this->eltwise_param_ = other->eltwise_param_;
  other->eltwise_param_ = pEVar14;
  pEVar15 = this->exp_param_;
  this->exp_param_ = other->exp_param_;
  other->exp_param_ = pEVar15;
  pHVar16 = this->hdf5_data_param_;
  this->hdf5_data_param_ = other->hdf5_data_param_;
  other->hdf5_data_param_ = pHVar16;
  pHVar17 = this->hdf5_output_param_;
  this->hdf5_output_param_ = other->hdf5_output_param_;
  other->hdf5_output_param_ = pHVar17;
  pHVar18 = this->hinge_loss_param_;
  this->hinge_loss_param_ = other->hinge_loss_param_;
  other->hinge_loss_param_ = pHVar18;
  pIVar19 = this->image_data_param_;
  this->image_data_param_ = other->image_data_param_;
  other->image_data_param_ = pIVar19;
  pIVar20 = this->infogain_loss_param_;
  this->infogain_loss_param_ = other->infogain_loss_param_;
  other->infogain_loss_param_ = pIVar20;
  pIVar21 = this->inner_product_param_;
  this->inner_product_param_ = other->inner_product_param_;
  other->inner_product_param_ = pIVar21;
  pLVar22 = this->lrn_param_;
  this->lrn_param_ = other->lrn_param_;
  other->lrn_param_ = pLVar22;
  pMVar23 = this->memory_data_param_;
  this->memory_data_param_ = other->memory_data_param_;
  other->memory_data_param_ = pMVar23;
  pMVar24 = this->mvn_param_;
  this->mvn_param_ = other->mvn_param_;
  other->mvn_param_ = pMVar24;
  pPVar25 = this->pooling_param_;
  this->pooling_param_ = other->pooling_param_;
  other->pooling_param_ = pPVar25;
  pPVar26 = this->power_param_;
  this->power_param_ = other->power_param_;
  other->power_param_ = pPVar26;
  pRVar27 = this->relu_param_;
  this->relu_param_ = other->relu_param_;
  other->relu_param_ = pRVar27;
  pSVar28 = this->sigmoid_param_;
  this->sigmoid_param_ = other->sigmoid_param_;
  other->sigmoid_param_ = pSVar28;
  pSVar29 = this->softmax_param_;
  this->softmax_param_ = other->softmax_param_;
  other->softmax_param_ = pSVar29;
  pSVar30 = this->slice_param_;
  this->slice_param_ = other->slice_param_;
  other->slice_param_ = pSVar30;
  pTVar31 = this->tanh_param_;
  this->tanh_param_ = other->tanh_param_;
  other->tanh_param_ = pTVar31;
  pTVar32 = this->threshold_param_;
  this->threshold_param_ = other->threshold_param_;
  other->threshold_param_ = pTVar32;
  pWVar33 = this->window_data_param_;
  this->window_data_param_ = other->window_data_param_;
  other->window_data_param_ = pWVar33;
  pPVar34 = this->python_param_;
  this->python_param_ = other->python_param_;
  other->python_param_ = pPVar34;
  pPVar35 = this->prelu_param_;
  this->prelu_param_ = other->prelu_param_;
  other->prelu_param_ = pPVar35;
  pSVar36 = this->spp_param_;
  this->spp_param_ = other->spp_param_;
  other->spp_param_ = pSVar36;
  pRVar37 = this->reshape_param_;
  this->reshape_param_ = other->reshape_param_;
  other->reshape_param_ = pRVar37;
  pLVar38 = this->log_param_;
  this->log_param_ = other->log_param_;
  other->log_param_ = pLVar38;
  pFVar39 = this->flatten_param_;
  this->flatten_param_ = other->flatten_param_;
  other->flatten_param_ = pFVar39;
  pRVar40 = this->reduction_param_;
  this->reduction_param_ = other->reduction_param_;
  other->reduction_param_ = pRVar40;
  pEVar41 = this->embed_param_;
  this->embed_param_ = other->embed_param_;
  other->embed_param_ = pEVar41;
  pTVar42 = this->tile_param_;
  this->tile_param_ = other->tile_param_;
  other->tile_param_ = pTVar42;
  pBVar43 = this->batch_norm_param_;
  this->batch_norm_param_ = other->batch_norm_param_;
  other->batch_norm_param_ = pBVar43;
  pEVar44 = this->elu_param_;
  this->elu_param_ = other->elu_param_;
  other->elu_param_ = pEVar44;
  pBVar45 = this->bias_param_;
  this->bias_param_ = other->bias_param_;
  other->bias_param_ = pBVar45;
  pSVar46 = this->scale_param_;
  this->scale_param_ = other->scale_param_;
  other->scale_param_ = pSVar46;
  pIVar47 = this->input_param_;
  this->input_param_ = other->input_param_;
  other->input_param_ = pIVar47;
  pCVar48 = this->crop_param_;
  this->crop_param_ = other->crop_param_;
  other->crop_param_ = pCVar48;
  pPVar49 = this->parameter_param_;
  this->parameter_param_ = other->parameter_param_;
  other->parameter_param_ = pPVar49;
  pRVar50 = this->recurrent_param_;
  this->recurrent_param_ = other->recurrent_param_;
  other->recurrent_param_ = pRVar50;
  iVar1 = this->phase_;
  this->phase_ = other->phase_;
  other->phase_ = iVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  uVar2 = (this->_has_bits_).has_bits_[1];
  (this->_has_bits_).has_bits_[1] = (other->_has_bits_).has_bits_[1];
  (other->_has_bits_).has_bits_[1] = uVar2;
  pvVar51 = (other->_internal_metadata_).
            super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
            .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar51 & 1) == 0) goto LAB_004986b2;
LAB_004986a5:
    other_00 = (UnknownFieldSet *)((ulong)pvVar51 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar51 & 1) != 0) goto LAB_004986a5;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_004986b2:
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void LayerParameter::InternalSwap(LayerParameter* other) {
  bottom_.InternalSwap(&other->bottom_);
  top_.InternalSwap(&other->top_);
  loss_weight_.InternalSwap(&other->loss_weight_);
  param_.InternalSwap(&other->param_);
  blobs_.InternalSwap(&other->blobs_);
  include_.InternalSwap(&other->include_);
  exclude_.InternalSwap(&other->exclude_);
  propagate_down_.InternalSwap(&other->propagate_down_);
  name_.Swap(&other->name_);
  type_.Swap(&other->type_);
  std::swap(transform_param_, other->transform_param_);
  std::swap(loss_param_, other->loss_param_);
  std::swap(accuracy_param_, other->accuracy_param_);
  std::swap(argmax_param_, other->argmax_param_);
  std::swap(concat_param_, other->concat_param_);
  std::swap(contrastive_loss_param_, other->contrastive_loss_param_);
  std::swap(convolution_param_, other->convolution_param_);
  std::swap(data_param_, other->data_param_);
  std::swap(dropout_param_, other->dropout_param_);
  std::swap(dummy_data_param_, other->dummy_data_param_);
  std::swap(eltwise_param_, other->eltwise_param_);
  std::swap(exp_param_, other->exp_param_);
  std::swap(hdf5_data_param_, other->hdf5_data_param_);
  std::swap(hdf5_output_param_, other->hdf5_output_param_);
  std::swap(hinge_loss_param_, other->hinge_loss_param_);
  std::swap(image_data_param_, other->image_data_param_);
  std::swap(infogain_loss_param_, other->infogain_loss_param_);
  std::swap(inner_product_param_, other->inner_product_param_);
  std::swap(lrn_param_, other->lrn_param_);
  std::swap(memory_data_param_, other->memory_data_param_);
  std::swap(mvn_param_, other->mvn_param_);
  std::swap(pooling_param_, other->pooling_param_);
  std::swap(power_param_, other->power_param_);
  std::swap(relu_param_, other->relu_param_);
  std::swap(sigmoid_param_, other->sigmoid_param_);
  std::swap(softmax_param_, other->softmax_param_);
  std::swap(slice_param_, other->slice_param_);
  std::swap(tanh_param_, other->tanh_param_);
  std::swap(threshold_param_, other->threshold_param_);
  std::swap(window_data_param_, other->window_data_param_);
  std::swap(python_param_, other->python_param_);
  std::swap(prelu_param_, other->prelu_param_);
  std::swap(spp_param_, other->spp_param_);
  std::swap(reshape_param_, other->reshape_param_);
  std::swap(log_param_, other->log_param_);
  std::swap(flatten_param_, other->flatten_param_);
  std::swap(reduction_param_, other->reduction_param_);
  std::swap(embed_param_, other->embed_param_);
  std::swap(tile_param_, other->tile_param_);
  std::swap(batch_norm_param_, other->batch_norm_param_);
  std::swap(elu_param_, other->elu_param_);
  std::swap(bias_param_, other->bias_param_);
  std::swap(scale_param_, other->scale_param_);
  std::swap(input_param_, other->input_param_);
  std::swap(crop_param_, other->crop_param_);
  std::swap(parameter_param_, other->parameter_param_);
  std::swap(recurrent_param_, other->recurrent_param_);
  std::swap(phase_, other->phase_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  std::swap(_has_bits_[1], other->_has_bits_[1]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}